

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpToAJ(word *b,word *a,ec_o *ec,void *stack)

{
  long lVar1;
  bool_t bVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  word *t2;
  word *t1;
  size_t n;
  undefined4 local_4;
  
  lVar1 = *(long *)(*(long *)(in_RDX + 0x18) + 0x30);
  lVar3 = in_RCX + lVar1 * 8;
  lVar4 = lVar3 + lVar1 * 8;
  bVar2 = wwIsZero((word *)(in_RSI + lVar1 * 0x10),*(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  if (bVar2 == 0) {
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x78))
              (in_RCX,in_RSI + lVar1 * 0x10,*(undefined8 *)(in_RDX + 0x18),lVar4);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
              (lVar3,in_RCX,*(undefined8 *)(in_RDX + 0x18),lVar4);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
              (in_RDI,in_RSI,lVar3,*(undefined8 *)(in_RDX + 0x18),lVar4);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
              (lVar3,in_RCX,lVar3,*(undefined8 *)(in_RDX + 0x18),lVar4);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
              (in_RDI + lVar1 * 8,in_RSI + lVar1 * 8,lVar3,*(undefined8 *)(in_RDX + 0x18),lVar4);
  }
  local_4 = (uint)(bVar2 == 0);
  return local_4;
}

Assistant:

static bool_t ecpToAJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 3 * n, b, 2 * n));
	// a == O => b <- O
	if (qrIsZero(ecZ(a, n), ec->f))
		return FALSE;
	// t1 <- za^{-1}
	qrInv(t1, ecZ(a, n), ec->f, stack);
	// t2 <- t1^2
	qrSqr(t2, t1, ec->f, stack);
	// xb <- xa t2
	qrMul(ecX(b), ecX(a), t2, ec->f, stack);
	// t2 <- t1 t2
	qrMul(t2, t1, t2, ec->f, stack);
	// yb <- ya t2
	qrMul(ecY(b, n), ecY(a, n), t2, ec->f, stack);
	// b != O
	return TRUE;
}